

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O0

int archive_write_set_format_ar(archive_write *a)

{
  long lVar1;
  void *__s;
  archive *in_RDI;
  ar_w *ar;
  int local_4;
  
  lVar1._0_4_ = in_RDI[2].file_count;
  lVar1._4_4_ = in_RDI[2].archive_error_number;
  if (lVar1 != 0) {
    (**(code **)&in_RDI[2].file_count)(in_RDI);
  }
  __s = malloc(0x28);
  if (__s == (void *)0x0) {
    archive_set_error(in_RDI,0xc,"Can\'t allocate ar data");
    local_4 = -0x1e;
  }
  else {
    memset(__s,0,0x28);
    *(void **)&in_RDI[1].current_codepage = __s;
    in_RDI[1].sconv = (archive_string_conv *)0x1afb62;
    in_RDI[2].archive_format_name = (char *)archive_write_ar_header;
    *(code **)&in_RDI[2].compression_code = archive_write_ar_data;
    in_RDI[2].compression_name = (char *)archive_write_ar_close;
    *(code **)&in_RDI[2].file_count = archive_write_ar_free;
    *(code **)&in_RDI[2].archive_format = archive_write_ar_finish_entry;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
archive_write_set_format_ar(struct archive_write *a)
{
	struct ar_w *ar;

	/* If someone else was already registered, unregister them. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	ar = (struct ar_w *)malloc(sizeof(*ar));
	if (ar == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Can't allocate ar data");
		return (ARCHIVE_FATAL);
	}
	memset(ar, 0, sizeof(*ar));
	a->format_data = ar;

	a->format_name = "ar";
	a->format_write_header = archive_write_ar_header;
	a->format_write_data = archive_write_ar_data;
	a->format_close = archive_write_ar_close;
	a->format_free = archive_write_ar_free;
	a->format_finish_entry = archive_write_ar_finish_entry;
	return (ARCHIVE_OK);
}